

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

MetaCommandResult runCommand(string *input,Table *t)

{
  bool bVar1;
  ostream *this;
  Table *t_local;
  string *input_local;
  
  bVar1 = std::operator==(input,".exit");
  if (!bVar1) {
    bVar1 = std::operator==(input,".constants");
    if (bVar1) {
      print_constants();
      input_local._4_4_ = CommandSuccess;
    }
    else {
      bVar1 = std::operator==(input,".btree");
      if (bVar1) {
        this = std::operator<<((ostream *)&std::cout,"Tree: ");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        Table::print(t,0,0);
        input_local._4_4_ = CommandSuccess;
      }
      else {
        input_local._4_4_ = CommandUnrecognized;
      }
    }
    return input_local._4_4_;
  }
  Table::dbClose(t);
  if (t != (Table *)0x0) {
    Table::~Table(t);
    operator_delete(t,0x10);
  }
  exit(0);
}

Assistant:

MetaCommandResult runCommand(std::string input, Table *t) {
	if (input == ".exit") {
		t->dbClose();
		delete t;
		exit(EXIT_SUCCESS);
	} else if(input == ".constants") {
		print_constants();
		return MetaCommandResult::CommandSuccess;
	} else if (input == ".btree") {
		std::cout<<"Tree: " << std::endl;
		t->print(0, 0);
		return MetaCommandResult::CommandSuccess;
	} else {
		return MetaCommandResult::CommandUnrecognized;
	}
}